

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

InterpolationRange * __thiscall
tcu::anon_unknown_3::MultisampleLineInterpolator::interpolate
          (InterpolationRange *__return_storage_ptr__,MultisampleLineInterpolator *this,
          int primitiveNdx,IVec2 *pixel,IVec2 *viewportSize,bool multisample,int subpixelBits)

{
  int iVar1;
  int iVar2;
  const_reference pvVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Vector<float,_3> local_100;
  Vector<float,_3> local_f4;
  Vector<float,_2> local_e8;
  Vector<float,_2> local_e0;
  Vector<float,_2> local_d8;
  Vec2 maxWeights;
  Vector<float,_2> local_c8;
  Vector<float,_2> local_c0;
  Vec2 minWeights;
  LineInterpolationRange weights [4];
  Vector<float,_2> local_70;
  Vec2 pb;
  Vec2 pa;
  float wb;
  float wa;
  Vec2 corners [4];
  int lineNdx;
  bool multisample_local;
  IVec2 *viewportSize_local;
  IVec2 *pixel_local;
  int primitiveNdx_local;
  MultisampleLineInterpolator *this_local;
  InterpolationRange *result;
  
  corners[3].m_data[0] = (float)(primitiveNdx / 2);
  corners[3].m_data[1]._3_1_ = multisample;
  iVar1 = Vector<int,_2>::x(pixel);
  iVar2 = Vector<int,_2>::y(pixel);
  Vector<float,_2>::Vector((Vector<float,_2> *)&wb,(float)iVar1 + 0.0,(float)iVar2 + 0.0);
  iVar1 = Vector<int,_2>::x(pixel);
  iVar2 = Vector<int,_2>::y(pixel);
  Vector<float,_2>::Vector(corners,(float)iVar1 + 0.0,(float)iVar2 + 1.0);
  iVar1 = Vector<int,_2>::x(pixel);
  iVar2 = Vector<int,_2>::y(pixel);
  Vector<float,_2>::Vector(corners + 1,(float)iVar1 + 1.0,(float)iVar2 + 1.0);
  iVar1 = Vector<int,_2>::x(pixel);
  iVar2 = Vector<int,_2>::y(pixel);
  Vector<float,_2>::Vector(corners + 2,(float)iVar1 + 1.0,(float)iVar2 + 0.0);
  pvVar3 = std::
           vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
           operator[](&this->scene->lines,(long)(int)corners[3].m_data[0]);
  fVar4 = Vector<float,_4>::w(pvVar3->positions);
  pvVar3 = std::
           vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
           operator[](&this->scene->lines,(long)(int)corners[3].m_data[0]);
  fVar5 = Vector<float,_4>::w(pvVar3->positions + 1);
  pvVar3 = std::
           vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
           operator[](&this->scene->lines,(long)(int)corners[3].m_data[0]);
  fVar6 = Vector<float,_4>::x(pvVar3->positions);
  iVar1 = Vector<int,_2>::x(viewportSize);
  pvVar3 = std::
           vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
           operator[](&this->scene->lines,(long)(int)corners[3].m_data[0]);
  fVar7 = Vector<float,_4>::y(pvVar3->positions);
  iVar2 = Vector<int,_2>::y(viewportSize);
  Vector<float,_2>::Vector
            (&pb,(fVar6 / fVar4 + 1.0) * 0.5 * (float)iVar1,
             (fVar7 / fVar4 + 1.0) * 0.5 * (float)iVar2);
  pvVar3 = std::
           vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
           operator[](&this->scene->lines,(long)(int)corners[3].m_data[0]);
  fVar6 = Vector<float,_4>::x(pvVar3->positions + 1);
  iVar1 = Vector<int,_2>::x(viewportSize);
  pvVar3 = std::
           vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>::
           operator[](&this->scene->lines,(long)(int)corners[3].m_data[0]);
  fVar7 = Vector<float,_4>::y(pvVar3->positions + 1);
  iVar2 = Vector<int,_2>::y(viewportSize);
  Vector<float,_2>::Vector
            (&local_70,(fVar6 / fVar5 + 1.0) * 0.5 * (float)iVar1,
             (fVar7 / fVar5 + 1.0) * 0.5 * (float)iVar2);
  calcLineInterpolationWeights((anon_unknown_3 *)&minWeights,&pb,fVar4,&local_70,fVar5,(Vec2 *)&wb);
  calcLineInterpolationWeights((anon_unknown_3 *)&weights[0].min,&pb,fVar4,&local_70,fVar5,corners);
  calcLineInterpolationWeights
            ((anon_unknown_3 *)&weights[1].min,&pb,fVar4,&local_70,fVar5,corners + 1);
  calcLineInterpolationWeights
            ((anon_unknown_3 *)&weights[2].min,&pb,fVar4,&local_70,fVar5,corners + 2);
  min<float,2>((tcu *)&local_c8,&weights[0].max,&weights[1].max);
  min<float,2>((tcu *)&maxWeights,&weights[2].max,&weights[3].max);
  min<float,2>((tcu *)&local_c0,&local_c8,&maxWeights);
  max<float,2>((tcu *)&local_e0,&minWeights,&weights[0].min);
  max<float,2>((tcu *)&local_e8,&weights[1].min,&weights[2].min);
  max<float,2>((tcu *)&local_d8,&local_e0,&local_e8);
  InterpolationRange::InterpolationRange(__return_storage_ptr__);
  fVar4 = Vector<float,_2>::x(&local_c0);
  fVar5 = Vector<float,_2>::y(&local_c0);
  Vector<float,_3>::Vector(&local_f4,fVar4,0.0,fVar5);
  *(undefined8 *)(__return_storage_ptr__->min).m_data = local_f4.m_data._0_8_;
  (__return_storage_ptr__->min).m_data[2] = local_f4.m_data[2];
  fVar4 = Vector<float,_2>::x(&local_d8);
  fVar5 = Vector<float,_2>::y(&local_d8);
  Vector<float,_3>::Vector(&local_100,fVar4,0.0,fVar5);
  *(undefined8 *)(__return_storage_ptr__->max).m_data = local_100.m_data._0_8_;
  (__return_storage_ptr__->max).m_data[2] = local_100.m_data[2];
  return __return_storage_ptr__;
}

Assistant:

InterpolationRange interpolate (int primitiveNdx, const tcu::IVec2 pixel, const tcu::IVec2 viewportSize, bool multisample, int subpixelBits) const
	{
		DE_UNREF(multisample);
		DE_UNREF(subpixelBits);

		// in triangulation, one line emits two triangles
		const int		lineNdx		= primitiveNdx / 2;

		// allow interpolation weights anywhere in the pixel
		const tcu::Vec2 corners[4] =
		{
			tcu::Vec2((float)pixel.x() + 0.0f, (float)pixel.y() + 0.0f),
			tcu::Vec2((float)pixel.x() + 0.0f, (float)pixel.y() + 1.0f),
			tcu::Vec2((float)pixel.x() + 1.0f, (float)pixel.y() + 1.0f),
			tcu::Vec2((float)pixel.x() + 1.0f, (float)pixel.y() + 0.0f),
		};

		const float		wa = scene.lines[lineNdx].positions[0].w();
		const float		wb = scene.lines[lineNdx].positions[1].w();
		const tcu::Vec2	pa = tcu::Vec2((scene.lines[lineNdx].positions[0].x() / wa + 1.0f) * 0.5f * (float)viewportSize.x(),
									   (scene.lines[lineNdx].positions[0].y() / wa + 1.0f) * 0.5f * (float)viewportSize.y());
		const tcu::Vec2	pb = tcu::Vec2((scene.lines[lineNdx].positions[1].x() / wb + 1.0f) * 0.5f * (float)viewportSize.x(),
									   (scene.lines[lineNdx].positions[1].y() / wb + 1.0f) * 0.5f * (float)viewportSize.y());

		// calculate interpolation as a line
		const LineInterpolationRange weights[4] =
		{
			calcLineInterpolationWeights(pa, wa, pb, wb, corners[0]),
			calcLineInterpolationWeights(pa, wa, pb, wb, corners[1]),
			calcLineInterpolationWeights(pa, wa, pb, wb, corners[2]),
			calcLineInterpolationWeights(pa, wa, pb, wb, corners[3]),
		};

		const tcu::Vec2 minWeights = tcu::min(tcu::min(weights[0].min, weights[1].min), tcu::min(weights[2].min, weights[3].min));
		const tcu::Vec2 maxWeights = tcu::max(tcu::max(weights[0].max, weights[1].max), tcu::max(weights[2].max, weights[3].max));

		// convert to three-component form. For all triangles, the vertex 0 is always emitted by the line starting point, and vertex 2 by the ending point
		InterpolationRange result;
		result.min = tcu::Vec3(minWeights.x(), 0.0f, minWeights.y());
		result.max = tcu::Vec3(maxWeights.x(), 0.0f, maxWeights.y());
		return result;
	}